

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O3

void __thiscall OB::Color::Color(Color *this,string *k,value fg)

{
  this->_valid = false;
  this->_fg = fg != bg;
  (this->_key)._M_dataplus._M_p = (pointer)&(this->_key).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_key,"clear","");
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_local_buf[0] = '\0';
  this->_mode = null;
  (this->_hsl).h = 50.0;
  (this->_hsl).s = 50.0;
  (this->_hsl).l = 50.0;
  key(this,k);
  return;
}

Assistant:

Color(std::string const& k, Type::value const fg = Type::value::fg) :
    _fg {static_cast<bool>(fg)}
  {
    key(k);
  }